

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaScl.c
# Opt level: O2

int Gia_ManSeqMarkUsed_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vRoots)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Gia_Obj_t *pObj_00;
  int *piVar5;
  int iVar6;
  
  iVar6 = 0;
  while( true ) {
    while( true ) {
      uVar2 = (uint)*(ulong *)pObj;
      if ((uVar2 >> 0x1e & 1) == 0) {
        return iVar6;
      }
      *(ulong *)pObj = *(ulong *)pObj & 0xffffffffbfffffff;
      if ((-1 < (int)uVar2) || ((uVar2 & 0x1fffffff) == 0x1fffffff)) break;
      pObj = pObj + -(ulong)(uVar2 & 0x1fffffff);
    }
    iVar1 = Gia_ObjIsRo(p,pObj);
    if (iVar1 != 0) break;
    if (((int)(uint)*(undefined8 *)pObj < 0) ||
       (uVar2 = (uint)*(undefined8 *)pObj & 0x1fffffff, uVar2 == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaScl.c"
                    ,0x8c,"int Gia_ManSeqMarkUsed_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
    }
    iVar1 = Gia_ManSeqMarkUsed_rec(p,pObj + -(ulong)uVar2,vRoots);
    pObj = pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
    iVar6 = iVar6 + iVar1 + 1;
  }
  iVar1 = Gia_ObjIsRo(p,pObj);
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsRo(p, pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1cf,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
  }
  iVar1 = p->vCos->nSize;
  iVar4 = p->vCis->nSize;
  iVar3 = Gia_ObjCioId(pObj);
  pObj_00 = Gia_ManCo(p,(iVar1 - iVar4) + iVar3);
  iVar4 = Gia_ObjId(p,pObj_00);
  iVar1 = vRoots->nSize;
  if (iVar1 == vRoots->nCap) {
    uVar2 = 0x10;
    if (0xf < iVar1) {
      uVar2 = iVar1 * 2;
    }
    if (iVar1 < (int)uVar2) {
      if (vRoots->pArray == (int *)0x0) {
        piVar5 = (int *)malloc((ulong)uVar2 << 2);
      }
      else {
        piVar5 = (int *)realloc(vRoots->pArray,(ulong)uVar2 << 2);
      }
      vRoots->pArray = piVar5;
      if (piVar5 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      vRoots->nCap = uVar2;
      iVar1 = vRoots->nSize;
    }
  }
  vRoots->nSize = iVar1 + 1;
  vRoots->pArray[iVar1] = iVar4;
  return iVar6;
}

Assistant:

int Gia_ManSeqMarkUsed_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vRoots )
{
    if ( !pObj->fMark0 )
        return 0;
    pObj->fMark0 = 0;
    if ( Gia_ObjIsCo(pObj) )
        return Gia_ManSeqMarkUsed_rec( p, Gia_ObjFanin0(pObj), vRoots );
    if ( Gia_ObjIsRo(p, pObj) )
    {
        Vec_IntPush( vRoots, Gia_ObjId(p, Gia_ObjRoToRi(p, pObj)) );
        return 0;
    }
    assert( Gia_ObjIsAnd(pObj) );
    return 1 + Gia_ManSeqMarkUsed_rec( p, Gia_ObjFanin0(pObj), vRoots )
             + Gia_ManSeqMarkUsed_rec( p, Gia_ObjFanin1(pObj), vRoots );
}